

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O3

int cubeb_stream_init(cubeb *context,cubeb_stream **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency,cubeb_data_callback data_callback,
                     cubeb_state_callback state_callback,void *user_ptr)

{
  cubeb_log_level cVar1;
  int extraout_EAX;
  cubeb_log_callback p_Var2;
  int iVar3;
  cubeb_sample_format cVar4;
  ulong uVar5;
  cubeb_stream_params *pcVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_4_ = -(uint)(context == (cubeb *)0x0);
  auVar8._4_4_ = -(uint)(stream == (cubeb_stream **)0x0);
  auVar8._8_4_ = -(uint)(data_callback == (cubeb_data_callback)0x0);
  auVar8._12_4_ = -(uint)(state_callback == (cubeb_state_callback)0x0);
  iVar3 = movmskps((int)input_stream_params,auVar8);
  if (iVar3 != 0) {
    return -3;
  }
  if (input_stream_params == (cubeb_stream_params *)0x0 &&
      output_stream_params == (cubeb_stream_params *)0x0) {
    cubeb_stream_init_cold_1();
    if (context != (cubeb *)0x0) {
      iVar3 = (**(code **)(context->ops->init + 0x50))();
      return iVar3;
    }
    return extraout_EAX;
  }
  if (output_stream_params != (cubeb_stream_params *)0x0) {
    if (output_stream_params->rate - 0xbb801 < 0xfff44be7) {
      return -2;
    }
    if (output_stream_params->channels - 0x100 < 0xffffff01) {
      return -2;
    }
  }
  pcVar6 = output_stream_params;
  if (input_stream_params != (cubeb_stream_params *)0x0) {
    if (input_stream_params->rate - 0xbb801 < 0xfff44be7) {
      return -2;
    }
    if (input_stream_params->channels - 0x100 < 0xffffff01) {
      return -2;
    }
    pcVar6 = input_stream_params;
    if (output_stream_params != (cubeb_stream_params *)0x0) {
      if (input_stream_params->rate != output_stream_params->rate) {
        return -2;
      }
      cVar4 = input_stream_params->format;
      if (cVar4 != output_stream_params->format) {
        return -2;
      }
      goto LAB_0010a429;
    }
  }
  cVar4 = pcVar6->format;
LAB_0010a429:
  if (cVar4 < 4) {
    if (95999 < latency - 1) {
      return -3;
    }
    iVar3 = (*context->ops->stream_init)
                      (context,stream,stream_name,input_device,input_stream_params,output_device,
                       output_stream_params,latency,data_callback,state_callback,user_ptr);
    if (iVar3 != -2) {
      return iVar3;
    }
    cVar1 = cubeb_log_get_level();
    if ((cVar1 != CUBEB_LOG_DISABLED) &&
       (p_Var2 = cubeb_log_get_callback(), p_Var2 != (cubeb_log_callback)0x0)) {
      uVar7 = 0;
      uVar5 = 0;
      if (output_stream_params != (cubeb_stream_params *)0x0) {
        uVar5 = (ulong)(output_stream_params->format != CUBEB_SAMPLE_S16LE);
      }
      if (input_stream_params != (cubeb_stream_params *)0x0) {
        uVar7 = (ulong)(input_stream_params->format != CUBEB_SAMPLE_S16LE);
      }
      cubeb_log_internal("cubeb.c",0x191,"Invalid format, %p %p %d %d",output_stream_params,
                         input_stream_params,uVar5,uVar7);
    }
  }
  return -2;
}

Assistant:

int
cubeb_stream_init(cubeb * context, cubeb_stream ** stream,
                  char const * stream_name, cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency, cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback, void * user_ptr)
{
  int r;

  if (!context || !stream || !data_callback || !state_callback) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if ((r = validate_stream_params(input_stream_params, output_stream_params)) !=
          CUBEB_OK ||
      (r = validate_latency(latency)) != CUBEB_OK) {
    return r;
  }

  r = context->ops->stream_init(context, stream, stream_name, input_device,
                                input_stream_params, output_device,
                                output_stream_params, latency, data_callback,
                                state_callback, user_ptr);

  if (r == CUBEB_ERROR_INVALID_FORMAT) {
    LOG("Invalid format, %p %p %d %d", output_stream_params,
        input_stream_params,
        output_stream_params && output_stream_params->format,
        input_stream_params && input_stream_params->format);
  }

  return r;
}